

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppCustomRendering(bool *p_open)

{
  bool bVar1;
  ImVec2 *pIVar2;
  float _y;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiWindowFlags in_stack_00000034;
  bool *in_stack_00000038;
  char *in_stack_00000040;
  ImVec2 window_center;
  ImVec2 window_size;
  ImVec2 window_pos;
  int n_1;
  float y_1;
  float x_1;
  float GRID_STEP;
  ImVec2 drag_delta;
  float mouse_threshold_for_pan;
  ImVec2 mouse_pos_in_canvas;
  ImVec2 origin;
  bool is_active;
  bool is_hovered;
  ImDrawList *draw_list_1;
  ImGuiIO *io;
  ImVec2 canvas_p1;
  ImVec2 canvas_sz;
  ImVec2 canvas_p0;
  ImVec2 cp4 [4];
  ImVec2 cp3 [3];
  float th;
  int n;
  float y;
  float x;
  int curve_segments;
  int circle_segments;
  float rounding;
  ImDrawFlags corners_tl_br;
  float spacing;
  ImU32 col;
  ImVec2 p;
  ImU32 col_b_1;
  ImU32 col_a_1;
  ImVec2 p1_1;
  ImVec2 p0_1;
  ImU32 col_b;
  ImU32 col_a;
  ImVec2 p1;
  ImVec2 p0;
  ImVec2 gradient_size;
  ImDrawList *draw_list;
  float in_stack_fffffffffffffc28;
  ImU32 IVar5;
  float in_stack_fffffffffffffc2c;
  float in_stack_fffffffffffffc30;
  float in_stack_fffffffffffffc34;
  float in_stack_fffffffffffffc38;
  float fVar6;
  float in_stack_fffffffffffffc3c;
  int iVar7;
  float in_stack_fffffffffffffc40;
  float in_stack_fffffffffffffc44;
  float in_stack_fffffffffffffc48;
  float in_stack_fffffffffffffc4c;
  float in_stack_fffffffffffffc50;
  float in_stack_fffffffffffffc54;
  ImVec2 in_stack_fffffffffffffc58;
  ImVec2 in_stack_fffffffffffffc60;
  ImU32 in_stack_fffffffffffffc70;
  undefined4 local_38c;
  ImDrawList *in_stack_fffffffffffffc78;
  ImDrawList *in_stack_fffffffffffffc80;
  ImDrawList *in_stack_fffffffffffffc88;
  ImDrawList *in_stack_fffffffffffffc90;
  ImDrawList *in_stack_fffffffffffffcb0;
  ImDrawList *in_stack_fffffffffffffcb8;
  ImDrawList *in_stack_fffffffffffffcc0;
  ImDrawList *in_stack_fffffffffffffcc8;
  ImDrawList *in_stack_fffffffffffffcd0;
  float local_2f0;
  float local_2ec;
  int local_2e8;
  ImVec2 local_2a8;
  bool *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  ImVec2 local_290;
  ImVec2 local_288;
  int local_280;
  ImVec2 local_27c;
  ImVec2 local_274;
  float local_26c;
  ImVec2 local_268;
  ImVec2 local_260;
  float local_258;
  undefined4 local_254;
  ImVec2 local_248;
  ImVec2 local_240;
  undefined4 local_238;
  ImVec2 local_234;
  ImVec2 local_22c;
  byte local_222;
  byte local_221;
  ImVec2 local_220;
  ImGuiIO *local_218;
  ImVec2 local_20c;
  ImVec2 local_204;
  ImVec2 local_1fc;
  ImVec2 local_1e8;
  ImVec2 local_1e0;
  ImVec2 local_1d8;
  ImVec2 local_1d0;
  float in_stack_fffffffffffffe3c;
  ImVec2 in_stack_fffffffffffffe40;
  ImVec2 in_stack_fffffffffffffe48;
  ImVec2 local_1b0;
  ImVec2 local_1a8;
  ImVec2 local_1a0;
  ImVec2 local_198;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 IStack_140;
  ImVec2 IStack_138;
  ImVec2 IStack_130;
  ImVec2 local_128;
  ImVec2 IStack_120;
  ImVec2 IStack_118;
  ImVec2 local_110;
  ImVec2 local_108;
  ImVec2 local_100;
  ImVec2 local_f8;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  float local_88;
  int local_84;
  float local_80;
  float local_7c;
  float local_78;
  int local_74;
  float local_70;
  undefined4 local_6c;
  undefined4 local_68;
  ImU32 local_54;
  ImVec2 local_50;
  ImU32 local_48;
  ImU32 local_44;
  ImVec2 local_40;
  ImVec2 local_38;
  ImU32 local_30;
  ImU32 local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImDrawList *local_10;
  
  bVar1 = ImGui::Begin(in_stack_00000040,in_stack_00000038,in_stack_00000034);
  if (bVar1) {
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ceb,"Examples/Custom Rendering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar1 = ImGui::BeginTabBar((char *)in_stack_fffffffffffffc58,
                               (ImGuiTabBarFlags)in_stack_fffffffffffffc54);
    if (bVar1) {
      bVar1 = ImGui::BeginTabItem((char *)in_stack_fffffffffffffc58,
                                  (bool *)CONCAT44(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50),
                                  (ImGuiTabItemFlags)in_stack_fffffffffffffc4c);
      if (bVar1) {
        ImGui::GetFontSize();
        ImGui::PushItemWidth(in_stack_fffffffffffffc44);
        local_10 = ImGui::GetWindowDrawList();
        ImGui::Text("Gradients");
        fVar6 = ImGui::CalcItemWidth();
        _y = ImGui::GetFrameHeight();
        ImVec2::ImVec2(&local_18,fVar6,_y);
        local_20 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2(&local_28,local_20.x + local_18.x,local_20.y + local_18.y);
        local_2c = ImGui::GetColorU32(0xff000000);
        local_30 = ImGui::GetColorU32(0xffffffff);
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)in_stack_fffffffffffffc60,(ImVec2 *)in_stack_fffffffffffffc58,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImU32)in_stack_fffffffffffffc4c,(ImU32)in_stack_fffffffffffffc48,
                   (ImU32)in_stack_fffffffffffffc44,in_stack_fffffffffffffc70);
        ImGui::InvisibleButton
                  ((char *)in_stack_fffffffffffffc88,(ImVec2 *)in_stack_fffffffffffffc80,
                   (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        local_38 = ImGui::GetCursorScreenPos();
        ImVec2::ImVec2(&local_40,local_38.x + local_18.x,local_38.y + local_18.y);
        local_44 = ImGui::GetColorU32(0xff00ff00);
        local_48 = ImGui::GetColorU32(0xff0000ff);
        IVar5 = local_44;
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)in_stack_fffffffffffffc60,(ImVec2 *)in_stack_fffffffffffffc58,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImU32)in_stack_fffffffffffffc4c,(ImU32)in_stack_fffffffffffffc48,
                   (ImU32)in_stack_fffffffffffffc44,in_stack_fffffffffffffc70);
        ImGui::InvisibleButton
                  ((char *)in_stack_fffffffffffffc88,(ImVec2 *)in_stack_fffffffffffffc80,
                   (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        ImGui::Text("All primitives");
        ImGui::DragFloat((char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (float *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         in_stack_fffffffffffffc44,in_stack_fffffffffffffc40,
                         in_stack_fffffffffffffc3c,
                         (char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         (ImGuiSliderFlags)in_stack_fffffffffffffc2c);
        ImGui::DragFloat((char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (float *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         in_stack_fffffffffffffc44,in_stack_fffffffffffffc40,
                         in_stack_fffffffffffffc3c,
                         (char *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         (ImGuiSliderFlags)in_stack_fffffffffffffc2c);
        ImGui::SliderInt((char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (int *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                         (int)in_stack_fffffffffffffc44,(int)in_stack_fffffffffffffc40,
                         (char *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                         (ImGuiSliderFlags)in_stack_fffffffffffffc34);
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ImGui::GetStyle();
        ImGui::SameLine(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
        bVar1 = ImGui::SliderInt((char *)CONCAT44(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50),
                                 (int *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                ),(int)in_stack_fffffffffffffc44,
                                 (int)in_stack_fffffffffffffc40,
                                 (char *)CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                 (ImGuiSliderFlags)in_stack_fffffffffffffc34);
        ShowExampleAppCustomRendering::circle_segments_override =
             (bool)(ShowExampleAppCustomRendering::circle_segments_override & 1U | bVar1);
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ImGui::GetStyle();
        ImGui::SameLine(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
        bVar1 = ImGui::SliderInt((char *)CONCAT44(in_stack_fffffffffffffc54,
                                                  in_stack_fffffffffffffc50),
                                 (int *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                ),(int)in_stack_fffffffffffffc44,
                                 (int)in_stack_fffffffffffffc40,
                                 (char *)CONCAT44(in_stack_fffffffffffffc3c,
                                                  in_stack_fffffffffffffc38),
                                 (ImGuiSliderFlags)in_stack_fffffffffffffc34);
        ShowExampleAppCustomRendering::curve_segments_override =
             (bool)(ShowExampleAppCustomRendering::curve_segments_override & 1U | bVar1);
        ImGui::ColorEdit4((char *)in_stack_fffffffffffffe48,(float *)in_stack_fffffffffffffe40,
                          (ImGuiColorEditFlags)in_stack_fffffffffffffe3c);
        local_50 = ImGui::GetCursorScreenPos();
        ImColor::ImColor((ImColor *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                         (ImVec4 *)CONCAT44(in_stack_fffffffffffffc2c,IVar5));
        local_54 = ImColor::operator_cast_to_unsigned_int((ImColor *)0x168ca6);
        local_68 = 0x41200000;
        local_6c = 0x90;
        local_70 = ShowExampleAppCustomRendering::sz / 5.0;
        if ((ShowExampleAppCustomRendering::circle_segments_override & 1U) == 0) {
          local_2e8 = 0;
        }
        else {
          local_2e8 = ShowExampleAppCustomRendering::circle_segments_override_v;
        }
        local_74 = local_2e8;
        if ((ShowExampleAppCustomRendering::curve_segments_override & 1U) == 0) {
          local_2ec = 0.0;
        }
        else {
          local_2ec = (float)ShowExampleAppCustomRendering::curve_segments_override_v;
        }
        local_78 = local_2ec;
        local_80 = local_50.y + 4.0;
        for (local_84 = 0; local_7c = local_50.x + 4.0, local_84 < 2; local_84 = local_84 + 1) {
          if (local_84 == 0) {
            local_2f0 = 1.0;
          }
          else {
            local_2f0 = ShowExampleAppCustomRendering::thickness;
          }
          local_88 = local_2f0;
          in_stack_fffffffffffffcc8 = local_10;
          ImVec2::ImVec2(&local_90,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,
                         ShowExampleAppCustomRendering::sz * 0.5 + local_80);
          ImDrawList::AddNgon((ImDrawList *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                              (ImVec2 *)
                              CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                              in_stack_fffffffffffffc44,(ImU32)in_stack_fffffffffffffc40,
                              (int)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          in_stack_fffffffffffffcd0 = local_10;
          ImVec2::ImVec2(&local_98,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,
                         ShowExampleAppCustomRendering::sz * 0.5 + local_80);
          ImDrawList::AddCircle
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     in_stack_fffffffffffffc44,(ImU32)in_stack_fffffffffffffc40,
                     (int)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38);
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_a0,local_7c,local_80);
          ImVec2::ImVec2(&local_a8,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(in_stack_fffffffffffffcd0,(ImVec2 *)in_stack_fffffffffffffcc8,
                              (ImVec2 *)in_stack_fffffffffffffcc0,
                              (ImU32)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb8,0),
                              (ImDrawFlags)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb0,0));
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_b0,local_7c,local_80);
          ImVec2::ImVec2(&local_b8,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(in_stack_fffffffffffffcd0,(ImVec2 *)in_stack_fffffffffffffcc8,
                              (ImVec2 *)in_stack_fffffffffffffcc0,
                              (ImU32)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb8,0),
                              (ImDrawFlags)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb0,0));
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_c0,local_7c,local_80);
          ImVec2::ImVec2(&local_c8,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddRect(in_stack_fffffffffffffcd0,(ImVec2 *)in_stack_fffffffffffffcc8,
                              (ImVec2 *)in_stack_fffffffffffffcc0,
                              (ImU32)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb8,0),
                              (ImDrawFlags)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                              SUB84(in_stack_fffffffffffffcb0,0));
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_d0,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,local_80);
          ImVec2::ImVec2(&local_d8,local_7c + ShowExampleAppCustomRendering::sz,
                         (local_80 + ShowExampleAppCustomRendering::sz) - 0.5);
          ImVec2::ImVec2(&local_e0,local_7c,(local_80 + ShowExampleAppCustomRendering::sz) - 0.5);
          ImDrawList::AddTriangle
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     (ImU32)in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_e8,local_7c,local_80);
          ImVec2::ImVec2(&local_f0,local_7c + ShowExampleAppCustomRendering::sz,local_80);
          ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                              (ImVec2 *)in_stack_fffffffffffffc80,
                              (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                              SUB84(in_stack_fffffffffffffc78,0));
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_f8,local_7c,local_80);
          ImVec2::ImVec2(&local_100,local_7c,local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                              (ImVec2 *)in_stack_fffffffffffffc80,
                              (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                              SUB84(in_stack_fffffffffffffc78,0));
          local_7c = local_7c + 10.0;
          ImVec2::ImVec2(&local_108,local_7c,local_80);
          ImVec2::ImVec2(&local_110,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                              (ImVec2 *)in_stack_fffffffffffffc80,
                              (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                              SUB84(in_stack_fffffffffffffc78,0));
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_128,local_7c,ShowExampleAppCustomRendering::sz * 0.6 + local_80);
          ImVec2::ImVec2(&IStack_120,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,
                         -ShowExampleAppCustomRendering::sz * 0.4 + local_80);
          ImVec2::ImVec2(&IStack_118,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierQuadratic
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     (ImU32)in_stack_fffffffffffffc34,in_stack_fffffffffffffc30,
                     (int)in_stack_fffffffffffffc2c);
          local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
          ImVec2::ImVec2(&local_148,local_7c,local_80);
          ImVec2::ImVec2(&IStack_140,ShowExampleAppCustomRendering::sz * 1.3 + local_7c,
                         ShowExampleAppCustomRendering::sz * 0.3 + local_80);
          ImVec2::ImVec2(&IStack_138,
                         -ShowExampleAppCustomRendering::sz * 1.3 +
                         local_7c + ShowExampleAppCustomRendering::sz,
                         -ShowExampleAppCustomRendering::sz * 0.3 +
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImVec2::ImVec2(&IStack_130,local_7c + ShowExampleAppCustomRendering::sz,
                         local_80 + ShowExampleAppCustomRendering::sz);
          ImDrawList::AddBezierCubic
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (ImU32)in_stack_fffffffffffffc2c,local_78,(int)in_stack_fffffffffffffc60.x);
          local_80 = ShowExampleAppCustomRendering::sz + 10.0 + local_80;
        }
        in_stack_fffffffffffffc78 = local_10;
        ImVec2::ImVec2(&local_150,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,
                       ShowExampleAppCustomRendering::sz * 0.5 + local_80);
        ImDrawList::AddNgonFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   in_stack_fffffffffffffc34,(ImU32)in_stack_fffffffffffffc30,
                   (int)in_stack_fffffffffffffc2c);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        in_stack_fffffffffffffc80 = local_10;
        ImVec2::ImVec2(&local_158,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,
                       ShowExampleAppCustomRendering::sz * 0.5 + local_80);
        ImDrawList::AddCircleFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   in_stack_fffffffffffffc34,(ImU32)in_stack_fffffffffffffc30,
                   (int)in_stack_fffffffffffffc2c);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        in_stack_fffffffffffffc88 = local_10;
        ImVec2::ImVec2(&local_160,local_7c,local_80);
        ImVec2::ImVec2(&local_168,local_7c + ShowExampleAppCustomRendering::sz,
                       local_80 + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        in_stack_fffffffffffffc90 = local_10;
        ImVec2::ImVec2(&local_170,local_7c,local_80);
        ImVec2::ImVec2(&local_178,local_7c + ShowExampleAppCustomRendering::sz,
                       local_80 + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        ImVec2::ImVec2(&local_180,local_7c,local_80);
        ImVec2::ImVec2(&local_188,local_7c + ShowExampleAppCustomRendering::sz,
                       local_80 + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        ImVec2::ImVec2(&local_190,ShowExampleAppCustomRendering::sz * 0.5 + local_7c,local_80);
        ImVec2::ImVec2(&local_198,local_7c + ShowExampleAppCustomRendering::sz,
                       (local_80 + ShowExampleAppCustomRendering::sz) - 0.5);
        ImVec2::ImVec2(&local_1a0,local_7c,(local_80 + ShowExampleAppCustomRendering::sz) - 0.5);
        ImDrawList::AddTriangleFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                   (ImU32)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        ImVec2::ImVec2(&local_1a8,local_7c,local_80);
        ImVec2::ImVec2(&local_1b0,local_7c + ShowExampleAppCustomRendering::sz,
                       local_80 + ShowExampleAppCustomRendering::thickness);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + 10.0 + local_7c;
        in_stack_fffffffffffffcb0 = local_10;
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe48,local_7c,local_80);
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe40,
                       local_7c + ShowExampleAppCustomRendering::thickness,
                       local_80 + ShowExampleAppCustomRendering::sz);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = local_7c + 20.0;
        in_stack_fffffffffffffcb8 = local_10;
        ImVec2::ImVec2((ImVec2 *)&stack0xfffffffffffffe38,local_7c,local_80);
        ImVec2::ImVec2(&local_1d0,local_7c + 1.0,local_80 + 1.0);
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        local_7c = ShowExampleAppCustomRendering::sz + local_7c;
        in_stack_fffffffffffffcc0 = local_10;
        ImVec2::ImVec2(&local_1d8,local_7c,local_80);
        ImVec2::ImVec2(&local_1e0,local_7c + ShowExampleAppCustomRendering::sz,
                       local_80 + ShowExampleAppCustomRendering::sz);
        in_stack_fffffffffffffc28 = -1.7146522e+38;
        ImDrawList::AddRectFilledMultiColor
                  ((ImDrawList *)in_stack_fffffffffffffc60,(ImVec2 *)in_stack_fffffffffffffc58,
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImU32)in_stack_fffffffffffffc4c,(ImU32)in_stack_fffffffffffffc48,
                   (ImU32)in_stack_fffffffffffffc44,in_stack_fffffffffffffc70);
        ImVec2::ImVec2(&local_1e8,(ShowExampleAppCustomRendering::sz + 10.0) * 10.2,
                       (ShowExampleAppCustomRendering::sz + 10.0) * 3.0);
        ImGui::Dummy((ImVec2 *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        ImGui::PopItemWidth();
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem((char *)in_stack_fffffffffffffc58,
                                  (bool *)CONCAT44(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50),
                                  (ImGuiTabItemFlags)in_stack_fffffffffffffc4c);
      if (bVar1) {
        if ((ShowExampleAppCustomRendering(bool*)::points == '\0') &&
           (iVar7 = __cxa_guard_acquire(&ShowExampleAppCustomRendering(bool*)::points), iVar7 != 0))
        {
          ImVector<ImVec2>::ImVector(&ShowExampleAppCustomRendering::points);
          __cxa_atexit(ImVector<ImVec2>::~ImVector,&ShowExampleAppCustomRendering::points,
                       &__dso_handle);
          __cxa_guard_release(&ShowExampleAppCustomRendering(bool*)::points);
        }
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ImGui::Text(
                   "Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu."
                   );
        local_1fc = ImGui::GetCursorScreenPos();
        local_204 = ImGui::GetContentRegionAvail();
        if (local_204.x < 50.0) {
          local_204.x = 50.0;
        }
        if (local_204.y < 50.0) {
          local_204.y = 50.0;
        }
        ImVec2::ImVec2(&local_20c,local_1fc.x + local_204.x,local_1fc.y + local_204.y);
        local_218 = ImGui::GetIO();
        local_220 = (ImVec2)ImGui::GetWindowDrawList();
        ImDrawList::AddRectFilled
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                   (ImVec2 *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                   (ImU32)in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                   (ImDrawFlags)in_stack_fffffffffffffc34);
        ImDrawList::AddRect(in_stack_fffffffffffffcd0,(ImVec2 *)in_stack_fffffffffffffcc8,
                            (ImVec2 *)in_stack_fffffffffffffcc0,
                            (ImU32)((ulong)in_stack_fffffffffffffcb8 >> 0x20),
                            SUB84(in_stack_fffffffffffffcb8,0),
                            (ImDrawFlags)((ulong)in_stack_fffffffffffffcb0 >> 0x20),
                            SUB84(in_stack_fffffffffffffcb0,0));
        ImGui::InvisibleButton
                  ((char *)in_stack_fffffffffffffc88,(ImVec2 *)in_stack_fffffffffffffc80,
                   (ImGuiButtonFlags)((ulong)in_stack_fffffffffffffc78 >> 0x20));
        local_221 = ImGui::IsItemHovered((ImGuiHoveredFlags)in_stack_fffffffffffffc40);
        local_222 = ImGui::IsItemActive();
        ImVec2::ImVec2(&local_22c,local_1fc.x + ShowExampleAppCustomRendering::scrolling.x,
                       local_1fc.y + ShowExampleAppCustomRendering::scrolling.y);
        ImVec2::ImVec2(&local_234,(local_218->MousePos).x - local_22c.x,
                       (local_218->MousePos).y - local_22c.y);
        if ((((local_221 & 1) != 0) && ((ShowExampleAppCustomRendering::adding_line & 1U) == 0)) &&
           (bVar1 = ImGui::IsMouseClicked
                              ((ImGuiMouseButton)in_stack_fffffffffffffc40,
                               SUB41((uint)in_stack_fffffffffffffc3c >> 0x18,0)), bVar1)) {
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          ImVector<ImVec2>::push_back
                    ((ImVector<ImVec2> *)
                     CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28));
          ShowExampleAppCustomRendering::adding_line = true;
        }
        if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
          pIVar2 = ImVector<ImVec2>::back(&ShowExampleAppCustomRendering::points);
          *pIVar2 = local_234;
          bVar1 = ImGui::IsMouseDown(0);
          if (!bVar1) {
            ShowExampleAppCustomRendering::adding_line = false;
          }
        }
        local_38c = 0xbf800000;
        if ((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) == 0) {
          local_38c = 0;
        }
        local_238 = local_38c;
        if (((local_222 & 1) != 0) &&
           (bVar1 = ImGui::IsMouseDragging
                              ((ImGuiMouseButton)in_stack_fffffffffffffc30,in_stack_fffffffffffffc2c
                              ), bVar1)) {
          ShowExampleAppCustomRendering::scrolling.x =
               (local_218->MouseDelta).x + ShowExampleAppCustomRendering::scrolling.x;
          ShowExampleAppCustomRendering::scrolling.y =
               (local_218->MouseDelta).y + ShowExampleAppCustomRendering::scrolling.y;
        }
        local_240 = ImGui::GetMouseDragDelta
                              ((ImGuiMouseButton)in_stack_fffffffffffffc2c,in_stack_fffffffffffffc28
                              );
        if (((ShowExampleAppCustomRendering::opt_enable_context_menu & 1U) != 0) &&
           (local_240.x == 0.0)) {
          if ((local_240.y == 0.0) && (!NAN(local_240.y))) {
            ImGui::OpenPopupOnItemClick
                      ((char *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                       (ImGuiPopupFlags)in_stack_fffffffffffffc4c);
          }
        }
        bVar1 = ImGui::BeginPopup((char *)CONCAT44(in_stack_fffffffffffffc3c,
                                                   in_stack_fffffffffffffc38),
                                  (ImGuiWindowFlags)in_stack_fffffffffffffc34);
        if (bVar1) {
          if ((ShowExampleAppCustomRendering::adding_line & 1U) != 0) {
            ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize
                      ((ImVector<ImVec2> *)
                       CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (int)in_stack_fffffffffffffc2c);
          }
          ShowExampleAppCustomRendering::adding_line = false;
          bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffffc34,
                                                   in_stack_fffffffffffffc30),
                                  (char *)CONCAT44(in_stack_fffffffffffffc2c,
                                                   in_stack_fffffffffffffc28),false,false);
          if (bVar1) {
            ImVector<ImVec2>::size(&ShowExampleAppCustomRendering::points);
            ImVector<ImVec2>::resize
                      ((ImVector<ImVec2> *)
                       CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                       (int)in_stack_fffffffffffffc2c);
          }
          bVar1 = ImGui::MenuItem((char *)CONCAT44(in_stack_fffffffffffffc34,
                                                   in_stack_fffffffffffffc30),
                                  (char *)CONCAT44(in_stack_fffffffffffffc2c,
                                                   in_stack_fffffffffffffc28),false,false);
          if (bVar1) {
            ImVector<ImVec2>::clear
                      ((ImVector<ImVec2> *)
                       CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
          }
          ImGui::EndPopup();
        }
        local_248 = local_1fc;
        ImDrawList::PushClipRect
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                   in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                   SUB41((uint)in_stack_fffffffffffffc4c >> 0x18,0));
        if ((ShowExampleAppCustomRendering::opt_enable_grid & 1U) != 0) {
          local_254 = 0x42800000;
          for (local_258 = fmodf(ShowExampleAppCustomRendering::scrolling.x,64.0);
              local_258 < local_204.x; local_258 = local_258 + 64.0) {
            ImVec2::ImVec2(&local_260,local_1fc.x + local_258,local_1fc.y);
            ImVec2::ImVec2(&local_268,local_1fc.x + local_258,local_20c.y);
            ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                                (ImVec2 *)in_stack_fffffffffffffc80,
                                (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                                SUB84(in_stack_fffffffffffffc78,0));
          }
          for (local_26c = fmodf(ShowExampleAppCustomRendering::scrolling.y,64.0);
              local_26c < local_204.y; local_26c = local_26c + 64.0) {
            ImVec2::ImVec2(&local_274,local_1fc.x,local_1fc.y + local_26c);
            ImVec2::ImVec2(&local_27c,local_20c.x,local_1fc.y + local_26c);
            ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                                (ImVec2 *)in_stack_fffffffffffffc80,
                                (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                                SUB84(in_stack_fffffffffffffc78,0));
          }
        }
        for (local_280 = 0; local_280 < ShowExampleAppCustomRendering::points.Size;
            local_280 = local_280 + 2) {
          in_stack_fffffffffffffc40 = local_22c.x;
          in_stack_fffffffffffffc58 = local_220;
          pIVar2 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_280);
          in_stack_fffffffffffffc48 = in_stack_fffffffffffffc40 + pIVar2->x;
          in_stack_fffffffffffffc44 = local_22c.y;
          pIVar2 = ImVector<ImVec2>::operator[](&ShowExampleAppCustomRendering::points,local_280);
          ImVec2::ImVec2(&local_288,in_stack_fffffffffffffc48,in_stack_fffffffffffffc44 + pIVar2->y)
          ;
          in_stack_fffffffffffffc4c = local_22c.x;
          pIVar2 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_280 + 1);
          in_stack_fffffffffffffc54 = in_stack_fffffffffffffc4c + pIVar2->x;
          in_stack_fffffffffffffc50 = local_22c.y;
          pIVar2 = ImVector<ImVec2>::operator[]
                             (&ShowExampleAppCustomRendering::points,local_280 + 1);
          ImVec2::ImVec2(&local_290,in_stack_fffffffffffffc54,in_stack_fffffffffffffc50 + pIVar2->y)
          ;
          ImDrawList::AddLine(in_stack_fffffffffffffc90,(ImVec2 *)in_stack_fffffffffffffc88,
                              (ImVec2 *)in_stack_fffffffffffffc80,
                              (ImU32)((ulong)in_stack_fffffffffffffc78 >> 0x20),
                              SUB84(in_stack_fffffffffffffc78,0));
        }
        ImDrawList::PopClipRect
                  ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
        ImGui::EndTabItem();
      }
      bVar1 = ImGui::BeginTabItem((char *)in_stack_fffffffffffffc58,
                                  (bool *)CONCAT44(in_stack_fffffffffffffc54,
                                                   in_stack_fffffffffffffc50),
                                  (ImGuiTabItemFlags)in_stack_fffffffffffffc4c);
      if (bVar1) {
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        fVar6 = 0.0;
        iVar7 = -0x40800000;
        ImGui::SameLine(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
        HelpMarker((char *)0x16a724);
        ImGui::Checkbox(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
        ImGui::SameLine(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30);
        HelpMarker((char *)0x16a754);
        IVar3 = ImGui::GetWindowPos();
        IVar4 = ImGui::GetWindowSize();
        ImVec2::ImVec2(&local_2a8,IVar4.x * 0.5 + IVar3.x,IVar4.y * 0.5 + IVar3.y);
        if ((ShowExampleAppCustomRendering::draw_bg & 1U) != 0) {
          ImGui::GetBackgroundDrawList();
          ImDrawList::AddCircle
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     in_stack_fffffffffffffc44,(ImU32)in_stack_fffffffffffffc40,iVar7,fVar6);
        }
        if ((ShowExampleAppCustomRendering::draw_fg & 1U) != 0) {
          ImGui::GetForegroundDrawList();
          ImDrawList::AddCircle
                    ((ImDrawList *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (ImVec2 *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
                     in_stack_fffffffffffffc44,(ImU32)in_stack_fffffffffffffc40,iVar7,fVar6);
        }
        ImGui::EndTabItem();
      }
      ImGui::EndTabBar();
    }
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppCustomRendering(bool* p_open)
{
    if (!ImGui::Begin("Example: Custom rendering", p_open))
    {
        ImGui::End();
        return;
    }
    IMGUI_DEMO_MARKER("Examples/Custom Rendering");

    // Tip: If you do a lot of custom rendering, you probably want to use your own geometrical types and benefit of
    // overloaded operators, etc. Define IM_VEC2_CLASS_EXTRA in imconfig.h to create implicit conversions between your
    // types and ImVec2/ImVec4. Dear ImGui defines overloaded operators but they are internal to imgui.cpp and not
    // exposed outside (to avoid messing with your types) In this example we are not using the maths operators!

    if (ImGui::BeginTabBar("##TabBar"))
    {
        if (ImGui::BeginTabItem("Primitives"))
        {
            ImGui::PushItemWidth(-ImGui::GetFontSize() * 15);
            ImDrawList* draw_list = ImGui::GetWindowDrawList();

            // Draw gradients
            // (note that those are currently exacerbating our sRGB/Linear issues)
            // Calling ImGui::GetColorU32() multiplies the given colors by the current Style Alpha, but you may pass the IM_COL32() directly as well..
            ImGui::Text("Gradients");
            ImVec2 gradient_size = ImVec2(ImGui::CalcItemWidth(), ImGui::GetFrameHeight());
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 0, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 255, 255, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient1", gradient_size);
            }
            {
                ImVec2 p0 = ImGui::GetCursorScreenPos();
                ImVec2 p1 = ImVec2(p0.x + gradient_size.x, p0.y + gradient_size.y);
                ImU32 col_a = ImGui::GetColorU32(IM_COL32(0, 255, 0, 255));
                ImU32 col_b = ImGui::GetColorU32(IM_COL32(255, 0, 0, 255));
                draw_list->AddRectFilledMultiColor(p0, p1, col_a, col_b, col_b, col_a);
                ImGui::InvisibleButton("##gradient2", gradient_size);
            }

            // Draw a bunch of primitives
            ImGui::Text("All primitives");
            static float sz = 36.0f;
            static float thickness = 3.0f;
            static int ngon_sides = 6;
            static bool circle_segments_override = false;
            static int circle_segments_override_v = 12;
            static bool curve_segments_override = false;
            static int curve_segments_override_v = 8;
            static ImVec4 colf = ImVec4(1.0f, 1.0f, 0.4f, 1.0f);
            ImGui::DragFloat("Size", &sz, 0.2f, 2.0f, 100.0f, "%.0f");
            ImGui::DragFloat("Thickness", &thickness, 0.05f, 1.0f, 8.0f, "%.02f");
            ImGui::SliderInt("N-gon sides", &ngon_sides, 3, 12);
            ImGui::Checkbox("##circlesegmentoverride", &circle_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            circle_segments_override |= ImGui::SliderInt("Circle segments override", &circle_segments_override_v, 3, 40);
            ImGui::Checkbox("##curvessegmentoverride", &curve_segments_override);
            ImGui::SameLine(0.0f, ImGui::GetStyle().ItemInnerSpacing.x);
            curve_segments_override |= ImGui::SliderInt("Curves segments override", &curve_segments_override_v, 3, 40);
            ImGui::ColorEdit4("Color", &colf.x);

            const ImVec2 p = ImGui::GetCursorScreenPos();
            const ImU32 col = ImColor(colf);
            const float spacing = 10.0f;
            const ImDrawFlags corners_tl_br = ImDrawFlags_RoundCornersTopLeft | ImDrawFlags_RoundCornersBottomRight;
            const float rounding = sz / 5.0f;
            const int circle_segments = circle_segments_override ? circle_segments_override_v : 0;
            const int curve_segments = curve_segments_override ? curve_segments_override_v : 0;
            float x = p.x + 4.0f;
            float y = p.y + 4.0f;
            for (int n = 0; n < 2; n++)
            {
                // First line uses a thickness of 1.0f, second line uses the configurable thickness
                float th = (n == 0) ? 1.0f : thickness;
                draw_list->AddNgon(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, ngon_sides, th);                 x += sz + spacing;  // N-gon
                draw_list->AddCircle(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments, th);          x += sz + spacing;  // Circle
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 0.0f, ImDrawFlags_None, th);          x += sz + spacing;  // Square
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, ImDrawFlags_None, th);      x += sz + spacing;  // Square with all rounded corners
                draw_list->AddRect(ImVec2(x, y), ImVec2(x + sz, y + sz), col, rounding, corners_tl_br, th);         x += sz + spacing;  // Square with two rounded corners
                draw_list->AddTriangle(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col, th);x += sz + spacing;  // Triangle
                //draw_list->AddTriangle(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col, th);x+= sz*0.4f + spacing; // Thin triangle
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y), col, th);                                       x += sz + spacing;  // Horizontal line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x, y + sz), col, th);                                       x += spacing;       // Vertical line (note: drawing a filled rectangle will be faster!)
                draw_list->AddLine(ImVec2(x, y), ImVec2(x + sz, y + sz), col, th);                                  x += sz + spacing;  // Diagonal line

                // Quadratic Bezier Curve (3 control points)
                ImVec2 cp3[3] = { ImVec2(x, y + sz * 0.6f), ImVec2(x + sz * 0.5f, y - sz * 0.4f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierQuadratic(cp3[0], cp3[1], cp3[2], col, th, curve_segments); x += sz + spacing;

                // Cubic Bezier Curve (4 control points)
                ImVec2 cp4[4] = { ImVec2(x, y), ImVec2(x + sz * 1.3f, y + sz * 0.3f), ImVec2(x + sz - sz * 1.3f, y + sz - sz * 0.3f), ImVec2(x + sz, y + sz) };
                draw_list->AddBezierCubic(cp4[0], cp4[1], cp4[2], cp4[3], col, th, curve_segments);

                x = p.x + 4;
                y += sz + spacing;
            }
            draw_list->AddNgonFilled(ImVec2(x + sz * 0.5f, y + sz * 0.5f), sz*0.5f, col, ngon_sides);               x += sz + spacing;  // N-gon
            draw_list->AddCircleFilled(ImVec2(x + sz*0.5f, y + sz*0.5f), sz*0.5f, col, circle_segments);            x += sz + spacing;  // Circle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col);                                    x += sz + spacing;  // Square
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f);                             x += sz + spacing;  // Square with all rounded corners
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + sz), col, 10.0f, corners_tl_br);              x += sz + spacing;  // Square with two rounded corners
            draw_list->AddTriangleFilled(ImVec2(x+sz*0.5f,y), ImVec2(x+sz, y+sz-0.5f), ImVec2(x, y+sz-0.5f), col);  x += sz + spacing;  // Triangle
            //draw_list->AddTriangleFilled(ImVec2(x+sz*0.2f,y), ImVec2(x, y+sz-0.5f), ImVec2(x+sz*0.4f, y+sz-0.5f), col); x += sz*0.4f + spacing; // Thin triangle
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + sz, y + thickness), col);                             x += sz + spacing;  // Horizontal line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + thickness, y + sz), col);                             x += spacing * 2.0f;// Vertical line (faster than AddLine, but only handle integer thickness)
            draw_list->AddRectFilled(ImVec2(x, y), ImVec2(x + 1, y + 1), col);                                      x += sz;            // Pixel (faster than AddLine)
            draw_list->AddRectFilledMultiColor(ImVec2(x, y), ImVec2(x + sz, y + sz), IM_COL32(0, 0, 0, 255), IM_COL32(255, 0, 0, 255), IM_COL32(255, 255, 0, 255), IM_COL32(0, 255, 0, 255));

            ImGui::Dummy(ImVec2((sz + spacing) * 10.2f, (sz + spacing) * 3.0f));
            ImGui::PopItemWidth();
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Canvas"))
        {
            static ImVector<ImVec2> points;
            static ImVec2 scrolling(0.0f, 0.0f);
            static bool opt_enable_grid = true;
            static bool opt_enable_context_menu = true;
            static bool adding_line = false;

            ImGui::Checkbox("Enable grid", &opt_enable_grid);
            ImGui::Checkbox("Enable context menu", &opt_enable_context_menu);
            ImGui::Text("Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu.");

            // Typically you would use a BeginChild()/EndChild() pair to benefit from a clipping region + own scrolling.
            // Here we demonstrate that this can be replaced by simple offsetting + custom drawing + PushClipRect/PopClipRect() calls.
            // To use a child window instead we could use, e.g:
            //      ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));      // Disable padding
            //      ImGui::PushStyleColor(ImGuiCol_ChildBg, IM_COL32(50, 50, 50, 255));  // Set a background color
            //      ImGui::BeginChild("canvas", ImVec2(0.0f, 0.0f), true, ImGuiWindowFlags_NoMove);
            //      ImGui::PopStyleColor();
            //      ImGui::PopStyleVar();
            //      [...]
            //      ImGui::EndChild();

            // Using InvisibleButton() as a convenience 1) it will advance the layout cursor and 2) allows us to use IsItemHovered()/IsItemActive()
            ImVec2 canvas_p0 = ImGui::GetCursorScreenPos();      // ImDrawList API uses screen coordinates!
            ImVec2 canvas_sz = ImGui::GetContentRegionAvail();   // Resize canvas to what's available
            if (canvas_sz.x < 50.0f) canvas_sz.x = 50.0f;
            if (canvas_sz.y < 50.0f) canvas_sz.y = 50.0f;
            ImVec2 canvas_p1 = ImVec2(canvas_p0.x + canvas_sz.x, canvas_p0.y + canvas_sz.y);

            // Draw border and background color
            ImGuiIO& io = ImGui::GetIO();
            ImDrawList* draw_list = ImGui::GetWindowDrawList();
            draw_list->AddRectFilled(canvas_p0, canvas_p1, IM_COL32(50, 50, 50, 255));
            draw_list->AddRect(canvas_p0, canvas_p1, IM_COL32(255, 255, 255, 255));

            // This will catch our interactions
            ImGui::InvisibleButton("canvas", canvas_sz, ImGuiButtonFlags_MouseButtonLeft | ImGuiButtonFlags_MouseButtonRight);
            const bool is_hovered = ImGui::IsItemHovered(); // Hovered
            const bool is_active = ImGui::IsItemActive();   // Held
            const ImVec2 origin(canvas_p0.x + scrolling.x, canvas_p0.y + scrolling.y); // Lock scrolled origin
            const ImVec2 mouse_pos_in_canvas(io.MousePos.x - origin.x, io.MousePos.y - origin.y);

            // Add first and second point
            if (is_hovered && !adding_line && ImGui::IsMouseClicked(ImGuiMouseButton_Left))
            {
                points.push_back(mouse_pos_in_canvas);
                points.push_back(mouse_pos_in_canvas);
                adding_line = true;
            }
            if (adding_line)
            {
                points.back() = mouse_pos_in_canvas;
                if (!ImGui::IsMouseDown(ImGuiMouseButton_Left))
                    adding_line = false;
            }

            // Pan (we use a zero mouse threshold when there's no context menu)
            // You may decide to make that threshold dynamic based on whether the mouse is hovering something etc.
            const float mouse_threshold_for_pan = opt_enable_context_menu ? -1.0f : 0.0f;
            if (is_active && ImGui::IsMouseDragging(ImGuiMouseButton_Right, mouse_threshold_for_pan))
            {
                scrolling.x += io.MouseDelta.x;
                scrolling.y += io.MouseDelta.y;
            }

            // Context menu (under default mouse threshold)
            ImVec2 drag_delta = ImGui::GetMouseDragDelta(ImGuiMouseButton_Right);
            if (opt_enable_context_menu && drag_delta.x == 0.0f && drag_delta.y == 0.0f)
                ImGui::OpenPopupOnItemClick("context", ImGuiPopupFlags_MouseButtonRight);
            if (ImGui::BeginPopup("context"))
            {
                if (adding_line)
                    points.resize(points.size() - 2);
                adding_line = false;
                if (ImGui::MenuItem("Remove one", NULL, false, points.Size > 0)) { points.resize(points.size() - 2); }
                if (ImGui::MenuItem("Remove all", NULL, false, points.Size > 0)) { points.clear(); }
                ImGui::EndPopup();
            }

            // Draw grid + all lines in the canvas
            draw_list->PushClipRect(canvas_p0, canvas_p1, true);
            if (opt_enable_grid)
            {
                const float GRID_STEP = 64.0f;
                for (float x = fmodf(scrolling.x, GRID_STEP); x < canvas_sz.x; x += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x + x, canvas_p0.y), ImVec2(canvas_p0.x + x, canvas_p1.y), IM_COL32(200, 200, 200, 40));
                for (float y = fmodf(scrolling.y, GRID_STEP); y < canvas_sz.y; y += GRID_STEP)
                    draw_list->AddLine(ImVec2(canvas_p0.x, canvas_p0.y + y), ImVec2(canvas_p1.x, canvas_p0.y + y), IM_COL32(200, 200, 200, 40));
            }
            for (int n = 0; n < points.Size; n += 2)
                draw_list->AddLine(ImVec2(origin.x + points[n].x, origin.y + points[n].y), ImVec2(origin.x + points[n + 1].x, origin.y + points[n + 1].y), IM_COL32(255, 255, 0, 255), 2.0f);
            draw_list->PopClipRect();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("BG/FG draw lists"))
        {
            static bool draw_bg = true;
            static bool draw_fg = true;
            ImGui::Checkbox("Draw in Background draw list", &draw_bg);
            ImGui::SameLine(); HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
            ImGui::Checkbox("Draw in Foreground draw list", &draw_fg);
            ImGui::SameLine(); HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
            ImVec2 window_pos = ImGui::GetWindowPos();
            ImVec2 window_size = ImGui::GetWindowSize();
            ImVec2 window_center = ImVec2(window_pos.x + window_size.x * 0.5f, window_pos.y + window_size.y * 0.5f);
            if (draw_bg)
                ImGui::GetBackgroundDrawList()->AddCircle(window_center, window_size.x * 0.6f, IM_COL32(255, 0, 0, 200), 0, 10 + 4);
            if (draw_fg)
                ImGui::GetForegroundDrawList()->AddCircle(window_center, window_size.y * 0.6f, IM_COL32(0, 255, 0, 200), 0, 10);
            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::End();
}